

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtabletmanager.cpp
# Opt level: O2

void __thiscall QEvdevTabletManager::~QEvdevTabletManager(QEvdevTabletManager *this)

{
  ~QEvdevTabletManager(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

QEvdevTabletManager::~QEvdevTabletManager()
{
}